

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_106462a::TNoContractionPropagator::visitAggregate
          (TNoContractionPropagator *this,TVisit param_1,TIntermAggregate *node)

{
  ObjectAccessChain *chain;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  long *plVar4;
  long lVar5;
  ObjectAccessChain next_level_accesschain;
  ObjectAccessChain precise_accesschain_index_str;
  StateSettingGuard<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  setup_remained_accesschain_for_next_level;
  string local_50 [32];
  
  bVar1 = true;
  if (((this->remained_accesschain_)._M_string_length != 0) &&
     ((node->super_TIntermOperator).op == EOpConstructStruct)) {
    chain = &this->remained_accesschain_;
    getFrontElement(&precise_accesschain_index_str,chain);
    uVar3 = strtoul(precise_accesschain_index_str._M_dataplus._M_p,(char **)0x0,10);
    iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    plVar4 = (long *)(**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var,iVar2) + 8) +
                                             (uVar3 & 0xffffffff) * 8) + 0x18))();
    if (plVar4 == (long *)0x0) {
      __assert_fail("potential_precise_node",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                    ,0x2a9,
                    "virtual bool (anonymous namespace)::TNoContractionPropagator::visitAggregate(glslang::TVisit, glslang::TIntermAggregate *)"
                   );
    }
    lVar5 = std::__cxx11::string::find((char)chain,0x2f);
    if (lVar5 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&next_level_accesschain,"",
                 (allocator<char> *)&setup_remained_accesschain_for_next_level);
    }
    else {
      std::__cxx11::string::substr((ulong)&next_level_accesschain,(ulong)chain);
    }
    std::__cxx11::string::string(local_50,(string *)&next_level_accesschain);
    setup_remained_accesschain_for_next_level.state_ptr_ = chain;
    std::__cxx11::string::string
              ((string *)&setup_remained_accesschain_for_next_level.previous_state_,(string *)chain)
    ;
    std::__cxx11::string::_M_assign((string *)chain);
    std::__cxx11::string::_M_dispose();
    (**(code **)(*plVar4 + 0x10))(plVar4,this);
    std::__cxx11::string::_M_assign((string *)setup_remained_accesschain_for_next_level.state_ptr_);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool visitAggregate(glslang::TVisit, glslang::TIntermAggregate* node) override
    {
        if (!remained_accesschain_.empty() && node->getOp() == glslang::EOpConstructStruct) {
            // This is a struct initializer node, and the remained
            // access chain is not empty, we need to refer to the
            // assignee_remained_access_chain_ to find the nested
            // 'precise' object. And we don't need to visit other nodes in this
            // aggregate node.

            // Gets the struct dereference index that leads to 'precise' object.
            ObjectAccessChain precise_accesschain_index_str =
                getFrontElement(remained_accesschain_);
            unsigned precise_accesschain_index = (unsigned)strtoul(precise_accesschain_index_str.c_str(), nullptr, 10);
            // Gets the node pointed by the access chain index extracted before.
            glslang::TIntermTyped* potential_precise_node =
                node->getSequence()[precise_accesschain_index]->getAsTyped();
            assert(potential_precise_node);
            // Pop the front access chain index from the path, and visit the nested node.
            {
                ObjectAccessChain next_level_accesschain =
                    subAccessChainFromSecondElement(remained_accesschain_);
                StateSettingGuard<ObjectAccessChain> setup_remained_accesschain_for_next_level(
                    &remained_accesschain_, next_level_accesschain);
                potential_precise_node->traverse(this);
            }
            return false;
        }
        return true;
    }